

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<int,int,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<int,-1,1,0,-1,1>>,3,0>
       ::run<Eigen::Matrix<int,_1,1,0,_1,1>>
                 (redux_evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *eval,
                 scalar_max_op<int,_int,_0> *func,Matrix<int,__1,_1,_0,__1,_1> *xpr)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  Scalar elements [4];
  
  uVar3 = (xpr->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar6 = uVar3;
  uVar5 = uVar3;
  if ((long)uVar3 < 0) {
    uVar6 = uVar3 + 3;
    uVar5 = uVar3 + 7;
  }
  puVar4 = (uint *)(eval->super_evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>.
                   m_d.data;
  if (uVar3 + 3 < 7) {
    elements[0] = *puVar4;
    if (1 < (long)uVar3) {
      uVar5 = 1;
      do {
        if (elements[0] <= (int)puVar4[uVar5]) {
          elements[0] = puVar4[uVar5];
        }
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    elements[0] = *puVar4;
    elements[1] = puVar4[1];
    elements[2] = puVar4[2];
    elements[3] = puVar4[3];
    if (7 < (long)uVar3) {
      uVar5 = uVar5 & 0xfffffffffffffff8;
      uVar15 = puVar4[4];
      uVar16 = puVar4[5];
      uVar17 = puVar4[6];
      uVar18 = puVar4[7];
      if (0xf < (long)uVar3) {
        lVar7 = 8;
        do {
          puVar1 = puVar4 + lVar7;
          puVar2 = puVar4 + 4 + lVar7;
          uVar11 = -(uint)((int)*puVar1 < elements[0]);
          uVar12 = -(uint)((int)puVar1[1] < elements[1]);
          uVar13 = -(uint)((int)puVar1[2] < elements[2]);
          uVar14 = -(uint)((int)puVar1[3] < elements[3]);
          elements[0] = ~uVar11 & *puVar1 | elements[0] & uVar11;
          elements[1] = ~uVar12 & puVar1[1] | elements[1] & uVar12;
          elements[2] = ~uVar13 & puVar1[2] | elements[2] & uVar13;
          elements[3] = ~uVar14 & puVar1[3] | elements[3] & uVar14;
          uVar11 = -(uint)((int)*puVar2 < (int)uVar15);
          uVar12 = -(uint)((int)puVar2[1] < (int)uVar16);
          uVar13 = -(uint)((int)puVar2[2] < (int)uVar17);
          uVar14 = -(uint)((int)puVar2[3] < (int)uVar18);
          uVar15 = ~uVar11 & *puVar2 | uVar15 & uVar11;
          uVar16 = ~uVar12 & puVar2[1] | uVar16 & uVar12;
          uVar17 = ~uVar13 & puVar2[2] | uVar17 & uVar13;
          uVar18 = ~uVar14 & puVar2[3] | uVar18 & uVar14;
          lVar7 = lVar7 + 8;
        } while (lVar7 < (long)uVar5);
      }
      elements[0] = ~-(uint)((int)uVar15 < elements[0]) & uVar15 |
                    elements[0] & -(uint)((int)uVar15 < elements[0]);
      elements[1] = ~-(uint)((int)uVar16 < elements[1]) & uVar16 |
                    elements[1] & -(uint)((int)uVar16 < elements[1]);
      elements[2] = ~-(uint)((int)uVar17 < elements[2]) & uVar17 |
                    elements[2] & -(uint)((int)uVar17 < elements[2]);
      elements[3] = ~-(uint)((int)uVar18 < elements[3]) & uVar18 |
                    elements[3] & -(uint)((int)uVar18 < elements[3]);
      if ((long)uVar5 < (long)uVar6) {
        puVar1 = puVar4 + uVar5;
        uVar15 = -(uint)((int)*puVar1 < elements[0]);
        uVar16 = -(uint)((int)puVar1[1] < elements[1]);
        uVar17 = -(uint)((int)puVar1[2] < elements[2]);
        uVar18 = -(uint)((int)puVar1[3] < elements[3]);
        elements[0] = elements[0] & uVar15 | ~uVar15 & *puVar1;
        elements[1] = elements[1] & uVar16 | ~uVar16 & puVar1[1];
        elements[2] = elements[2] & uVar17 | ~uVar17 & puVar1[2];
        elements[3] = elements[3] & uVar18 | ~uVar18 & puVar1[3];
      }
    }
    uVar5 = 2;
    do {
      uVar8 = 0;
      do {
        iVar9 = elements[uVar5 + uVar8];
        if (elements[uVar5 + uVar8] < elements[uVar8]) {
          iVar9 = elements[uVar8];
        }
        elements[uVar8] = iVar9;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
      bVar10 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar10);
    if ((long)uVar6 < (long)uVar3) {
      do {
        if (elements[0] <= (int)puVar4[uVar6]) {
          elements[0] = puVar4[uVar6];
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  return elements[0];
}

Assistant:

EIGEN_DEVICE_FUNC Index rows(void) const EIGEN_NOEXCEPT {return m_rows;}